

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzer.cpp
# Opt level: O1

void __thiscall SerialAnalyzer::SetupResults(SerialAnalyzer *this)

{
  SerialAnalyzerResults *pSVar1;
  SerialAnalyzerResults *this_00;
  
  this_00 = (SerialAnalyzerResults *)operator_new(0x20);
  SerialAnalyzerResults::SerialAnalyzerResults
            (this_00,this,
             (this->mSettings)._M_t.
             super___uniq_ptr_impl<SerialAnalyzerSettings,_std::default_delete<SerialAnalyzerSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_SerialAnalyzerSettings_*,_std::default_delete<SerialAnalyzerSettings>_>
             .super__Head_base<0UL,_SerialAnalyzerSettings_*,_false>._M_head_impl);
  pSVar1 = (this->mResults)._M_t.
           super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
           ._M_t.
           super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
           .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl;
  (this->mResults)._M_t.
  super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>._M_t.
  super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>.
  super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl = this_00;
  if (pSVar1 != (SerialAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar1 + 8))();
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn
            ((Channel *)
             (this->mResults)._M_t.
             super___uniq_ptr_impl<SerialAnalyzerResults,_std::default_delete<SerialAnalyzerResults>_>
             ._M_t.
             super__Tuple_impl<0UL,_SerialAnalyzerResults_*,_std::default_delete<SerialAnalyzerResults>_>
             .super__Head_base<0UL,_SerialAnalyzerResults_*,_false>._M_head_impl);
  return;
}

Assistant:

void SerialAnalyzer::SetupResults()
{
    // Unlike the worker thread, this function is called from the GUI thread
    // we need to reset the Results object here because it is exposed for direct access by the GUI, and it can't be deleted from the
    // WorkerThread

    mResults.reset( new SerialAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}